

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImGuiDockNode::ImGuiDockNode(ImGuiDockNode *this,ImGuiID id)

{
  (this->Windows).Size = 0;
  (this->Windows).Capacity = 0;
  (this->Windows).Data = (ImGuiWindow **)0x0;
  (this->WindowClass).ClassId = 0;
  (this->WindowClass).ParentViewportId = 0;
  (this->WindowClass).ViewportFlagsOverrideSet = 0;
  (this->WindowClass).ViewportFlagsOverrideClear = 0;
  *(undefined8 *)((long)&(this->WindowClass).ViewportFlagsOverrideSet + 1) = 0;
  *(undefined8 *)((long)&(this->WindowClass).DockNodeFlagsOverrideSet + 1) = 0;
  (this->Pos).x = 0.0;
  (this->Pos).y = 0.0;
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  (this->SizeRef).x = 0.0;
  (this->SizeRef).y = 0.0;
  (this->WindowClass).DockingAllowUnclassed = true;
  this->ID = id;
  this->SharedFlags = 0;
  this->LocalFlags = 0;
  this->TabBar = (ImGuiTabBar *)0x0;
  this->ParentNode = (ImGuiDockNode *)0x0;
  this->ChildNodes[0] = (ImGuiDockNode *)0x0;
  this->ChildNodes[1] = (ImGuiDockNode *)0x0;
  this->SplitAxis = ImGuiAxis_None;
  this->State = ImGuiDockNodeState_Unknown;
  this->HostWindow = (ImGuiWindow *)0x0;
  this->VisibleWindow = (ImGuiWindow *)0x0;
  this->CentralNode = (ImGuiDockNode *)0x0;
  this->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
  this->LastFrameAlive = -1;
  this->LastFrameActive = -1;
  this->LastFrameFocused = -1;
  this->LastFocusedNodeId = 0;
  this->SelectedTabId = 0;
  this->WantCloseTabId = 0;
  this->field_0xba = this->field_0xba & 0xf0;
  *(undefined2 *)&this->field_0xb8 = 0x209;
  return;
}

Assistant:

inline ImVector()                                       { Size = Capacity = 0; Data = NULL; }